

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::SetUp
          (CommandLineInterfaceTest *this)

{
  CommandLineInterface *this_00;
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  MockCodeGenerator *pMVar3;
  NullCodeGenerator *pNVar4;
  string_view name;
  string_view name_00;
  string_view name_01;
  string local_b0;
  string local_90;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_70;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_68;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_60;
  _Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false> local_58;
  string local_50;
  
  setenv("TEST_CASE",anon_var_dwarf_a12c75 + 5,1);
  pMVar3 = (MockCodeGenerator *)operator_new(0x50);
  name._M_str = "test_generator";
  name._M_len = 0xe;
  MockCodeGenerator::MockCodeGenerator(pMVar3,name);
  this->mock_generator_ = pMVar3;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--test_out","");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"--test_opt","");
  local_58._M_head_impl = (CodeGenerator *)pMVar3;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Test output.","");
  this_01 = &(this->super_CommandLineInterfaceTester).generators_;
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
  ::
  emplace_back<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>
            ((vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
              *)this_01,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_58);
  this_00 = &(this->super_CommandLineInterfaceTester).cli_;
  CommandLineInterface::RegisterGenerator
            (this_00,&local_90,&local_b0,
             (this->super_CommandLineInterfaceTester).generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl
             ,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((MockCodeGenerator *)local_58._M_head_impl != (MockCodeGenerator *)0x0) {
    (*((CodeGenerator *)&(local_58._M_head_impl)->_vptr_CodeGenerator)->_vptr_CodeGenerator[1])();
  }
  local_58._M_head_impl = (CodeGenerator *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-t","");
  pMVar3 = (MockCodeGenerator *)operator_new(0x50);
  name_00._M_str = "test_generator";
  name_00._M_len = 0xe;
  MockCodeGenerator::MockCodeGenerator(pMVar3,name_00);
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  local_60._M_head_impl = (CodeGenerator *)pMVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Test output.","");
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
  ::
  emplace_back<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>
            ((vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
              *)this_01,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_60);
  CommandLineInterface::RegisterGenerator
            (this_00,&local_90,
             (this->super_CommandLineInterfaceTester).generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl
             ,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((MockCodeGenerator *)local_60._M_head_impl != (MockCodeGenerator *)0x0) {
    (*((CodeGenerator *)&(local_60._M_head_impl)->_vptr_CodeGenerator)->_vptr_CodeGenerator[1])();
  }
  local_60._M_head_impl = (CodeGenerator *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--alt_out","");
  pMVar3 = (MockCodeGenerator *)operator_new(0x50);
  name_01._M_str = "alt_generator";
  name_01._M_len = 0xd;
  MockCodeGenerator::MockCodeGenerator(pMVar3,name_01);
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  local_68._M_head_impl = (CodeGenerator *)pMVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Alt output.","");
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
  ::
  emplace_back<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>
            ((vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
              *)this_01,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_68);
  CommandLineInterface::RegisterGenerator
            (this_00,&local_90,
             (this->super_CommandLineInterfaceTester).generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl
             ,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((MockCodeGenerator *)local_68._M_head_impl != (MockCodeGenerator *)0x0) {
    (*((CodeGenerator *)&(local_68._M_head_impl)->_vptr_CodeGenerator)->_vptr_CodeGenerator[1])();
  }
  local_68._M_head_impl = (CodeGenerator *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pNVar4 = (NullCodeGenerator *)operator_new(0x30);
  (pNVar4->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__NullCodeGenerator_01926248
  ;
  pNVar4->called_ = false;
  (pNVar4->parameter_)._M_dataplus._M_p = (pointer)&(pNVar4->parameter_).field_2;
  (pNVar4->parameter_)._M_string_length = 0;
  (pNVar4->parameter_).field_2._M_local_buf[0] = '\0';
  this->null_generator_ = pNVar4;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--null_out","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  local_70._M_head_impl = (CodeGenerator *)pNVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Null output.","");
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
  ::
  emplace_back<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>
            ((vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>>>
              *)this_01,
             (unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
              *)&local_70);
  CommandLineInterface::RegisterGenerator
            (this_00,&local_90,
             (this->super_CommandLineInterfaceTester).generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CodeGenerator_*,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::CodeGenerator_*,_false>._M_head_impl
             ,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((NullCodeGenerator *)local_70._M_head_impl != (NullCodeGenerator *)0x0) {
    (*((CodeGenerator *)&(local_70._M_head_impl)->_vptr_CodeGenerator)->_vptr_CodeGenerator[1])();
  }
  local_70._M_head_impl = (CodeGenerator *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CommandLineInterfaceTest::SetUp() {
  // Reset the mock generator's test case environment variable.
  SetMockGeneratorTestCase("");

  // Register generators.
  auto mock_generator = std::make_unique<MockCodeGenerator>("test_generator");
  mock_generator_ = mock_generator.get();
  RegisterGenerator("--test_out", "--test_opt", std::move(mock_generator),
                    "Test output.");
  RegisterGenerator("-t", std::make_unique<MockCodeGenerator>("test_generator"),
                    "Test output.");

  RegisterGenerator("--alt_out",
                    std::make_unique<MockCodeGenerator>("alt_generator"),
                    "Alt output.");

  auto null_generator = std::make_unique<NullCodeGenerator>();
  null_generator_ = null_generator.get();
  RegisterGenerator("--null_out", std::move(null_generator), "Null output.");

}